

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O2

void __thiscall QTabWidgetPrivate::showTab(QTabWidgetPrivate *this,int index)

{
  QTabWidget *this_00;
  int iVar1;
  
  this_00 = *(QTabWidget **)&(this->super_QWidgetPrivate).field_0x8;
  iVar1 = QStackedWidget::count(this->stack);
  if ((-1 < index) && (index < iVar1)) {
    QStackedWidget::setCurrentIndex(this->stack,index);
  }
  QTabWidget::currentChanged(this_00,index);
  return;
}

Assistant:

void QTabWidgetPrivate::showTab(int index)
{
    Q_Q(QTabWidget);
    if (index < stack->count() && index >= 0)
        stack->setCurrentIndex(index);
    emit q->currentChanged(index);
}